

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

MOJOSHADER_parseData * build_parsedata(Context *ctx)

{
  int iVar1;
  ConstantsList *pCVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined8 uVar5;
  undefined1 auVar6 [13];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  MOJOSHADER_parseData *__s;
  char *pcVar10;
  char *pcVar11;
  ConstantsList **ppCVar12;
  MOJOSHADER_error *pMVar13;
  MOJOSHADER_swizzle *__dest;
  MOJOSHADER_attribute *__s_00;
  MOJOSHADER_attribute *pMVar14;
  int iVar15;
  MOJOSHADER_constant *pMVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  RegisterList *pRVar20;
  RegisterType RVar21;
  int *piVar22;
  char **ppcVar23;
  MOJOSHADER_uniform *pMVar24;
  size_t sVar25;
  MOJOSHADER_attribute *pMVar26;
  MOJOSHADER_uniformType MVar27;
  VariableList *pVVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  size_t output_len;
  MOJOSHADER_uniform *local_b8;
  MOJOSHADER_constant *local_b0;
  MOJOSHADER_sampler *local_a0;
  size_t local_90;
  Buffer *local_88;
  Buffer *pBStack_80;
  Buffer *local_78;
  Buffer *pBStack_70;
  Buffer *local_68;
  Buffer *pBStack_60;
  Buffer *local_58;
  Buffer *pBStack_50;
  Buffer *local_48;
  Buffer *pBStack_40;
  Buffer *local_38;
  
  local_90 = 0;
  if (ctx->out_of_memory != 0) {
    return &MOJOSHADER_out_of_mem_data;
  }
  __s = (MOJOSHADER_parseData *)(*ctx->malloc)(0xd0,ctx->malloc_data);
  if (__s == (MOJOSHADER_parseData *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    return &MOJOSHADER_out_of_mem_data;
  }
  memset(__s,0,0xd0);
  if (ctx->isfail != 0) {
    local_b0 = (MOJOSHADER_constant *)0x0;
    pcVar10 = (char *)0x0;
    goto LAB_0010a6e1;
  }
  local_88 = ctx->preflight;
  pBStack_80 = ctx->globals;
  local_78 = ctx->inputs;
  pBStack_70 = ctx->outputs;
  local_68 = ctx->helpers;
  pBStack_60 = ctx->subroutines;
  local_58 = ctx->mainline_intro;
  pBStack_50 = ctx->mainline_arguments;
  local_48 = ctx->mainline_top;
  pBStack_40 = ctx->mainline;
  local_38 = ctx->postflight;
  pcVar10 = buffer_merge(&local_88,0xb,&local_90);
  if (ctx->isfail == 0) {
    local_b0 = (MOJOSHADER_constant *)(*ctx->malloc)(ctx->constant_count * 0x18,ctx->malloc_data);
    if (local_b0 == (MOJOSHADER_constant *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      goto LAB_0010a6cc;
    }
    if (0 < ctx->constant_count) {
      ppCVar12 = &ctx->constants;
      lVar19 = 0;
      pMVar16 = local_b0;
      do {
        pCVar2 = *ppCVar12;
        if (pCVar2 == (ConstantsList *)0x0) {
          failf(ctx,"%s","BUG: mismatched constant list and count");
          break;
        }
        *(undefined8 *)((long)&pMVar16->value + 8) =
             *(undefined8 *)((long)&(pCVar2->constant).value + 8);
        iVar17 = (pCVar2->constant).index;
        uVar5 = *(undefined8 *)&(pCVar2->constant).value;
        pMVar16->type = (pCVar2->constant).type;
        pMVar16->index = iVar17;
        *(undefined8 *)&pMVar16->value = uVar5;
        ppCVar12 = &pCVar2->next;
        lVar19 = lVar19 + 1;
        pMVar16 = pMVar16 + 1;
      } while (lVar19 < ctx->constant_count);
    }
    if (ctx->isfail != 0) goto LAB_0010a6e1;
    sVar25 = (long)ctx->uniform_count * 0x18;
    local_b8 = (MOJOSHADER_uniform *)(*ctx->malloc)((int)sVar25,ctx->malloc_data);
    if (local_b8 == (MOJOSHADER_uniform *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      goto LAB_0010a6e1;
    }
    iVar17 = 0;
    memset(local_b8,0,sVar25);
    pVVar28 = ctx->variables;
    pMVar24 = local_b8;
    if (pVVar28 != (VariableList *)0x0) {
      iVar17 = 0;
      do {
        if ((pVVar28->used != 0) &&
           (pcVar11 = (*ctx->profile->get_const_array_varname)(ctx,pVVar28->index,pVVar28->count),
           pcVar11 != (char *)0x0)) {
          pMVar24->type = MOJOSHADER_UNIFORM_FLOAT;
          iVar18 = pVVar28->count;
          pMVar24->index = pVVar28->index;
          pMVar24->array_count = iVar18;
          pMVar24->constant = (uint)(pVVar28->constant != (ConstantsList *)0x0);
          pMVar24->name = pcVar11;
          pMVar24 = pMVar24 + 1;
          iVar17 = iVar17 + 1;
        }
        pVVar28 = pVVar28->next;
      } while (pVVar28 != (VariableList *)0x0);
    }
    iVar18 = ctx->uniform_count;
    if (iVar17 < iVar18) {
      pRVar20 = &ctx->uniforms;
      MVar27 = MOJOSHADER_UNIFORM_FLOAT;
      do {
        pRVar20 = pRVar20->next;
        if (pRVar20 == (RegisterList *)0x0) {
          failf(ctx,"%s","BUG: mismatched uniform list and count");
          break;
        }
        RVar21 = pRVar20->regtype;
        iVar1 = pRVar20->regnum;
        iVar15 = iVar1;
        if (RVar21 == REG_TYPE_CONST) {
          MVar27 = MOJOSHADER_UNIFORM_FLOAT;
          if (pRVar20->array == (VariableList *)0x0) {
            RVar21 = REG_TYPE_CONST;
            goto LAB_0010ad2b;
          }
        }
        else {
          if (RVar21 == REG_TYPE_CONSTINT) {
            MVar27 = MOJOSHADER_UNIFORM_INT;
          }
          else if (RVar21 == REG_TYPE_CONSTBOOL) {
            MVar27 = MOJOSHADER_UNIFORM_BOOL;
          }
          else {
            failf(ctx,"%s","unknown uniform datatype");
            RVar21 = pRVar20->regtype;
            iVar15 = pRVar20->regnum;
          }
LAB_0010ad2b:
          pMVar24->type = MVar27;
          pMVar24->index = iVar1;
          pMVar24->array_count = 0;
          pcVar11 = (*ctx->profile->get_varname)(ctx,RVar21,iVar15);
          pMVar24->name = pcVar11;
          pMVar24 = pMVar24 + 1;
          iVar17 = iVar17 + 1;
          iVar18 = ctx->uniform_count;
        }
      } while (iVar17 < iVar18);
    }
    if (ctx->isfail == 0) {
      if ((long)ctx->attribute_count == 0) {
        uVar8 = 0;
        __s_00 = (MOJOSHADER_attribute *)0x0;
LAB_0010af08:
        if ((ctx->isfail == 0) && ((long)ctx->attribute_count != 0)) {
          sVar25 = (long)ctx->attribute_count << 4;
          pMVar14 = (MOJOSHADER_attribute *)(*ctx->malloc)((int)sVar25,ctx->malloc_data);
          if (pMVar14 != (MOJOSHADER_attribute *)0x0) {
            pRVar20 = (ctx->attributes).next;
            uVar9 = 0;
            memset(pMVar14,0,sVar25);
            iVar17 = ctx->attribute_count;
            if (0 < iVar17) {
              iVar18 = 0;
              uVar9 = 0;
              pMVar26 = pMVar14;
              do {
                if (pRVar20 == (RegisterList *)0x0) {
                  failf(ctx,"%s","BUG: mismatched attribute list and count");
                  break;
                }
                RVar21 = pRVar20->regtype;
                if ((RVar21 < REG_TYPE_SAMPLER) &&
                   ((0x370U >> (RVar21 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) != 0)) {
                  uVar7 = pRVar20->index;
                  pMVar26->usage = pRVar20->usage;
                  pMVar26->index = uVar7;
                  pcVar11 = (*ctx->profile->get_varname)(ctx,RVar21,pRVar20->regnum);
                  pMVar26->name = pcVar11;
                  pMVar26 = pMVar26 + 1;
                  uVar9 = uVar9 + 1;
                  iVar17 = ctx->attribute_count;
                }
                pRVar20 = pRVar20->next;
                iVar18 = iVar18 + 1;
              } while (iVar18 < iVar17);
            }
            goto LAB_0010a6f6;
          }
          ctx->isfail = 1;
          ctx->out_of_memory = 1;
        }
      }
      else {
        sVar25 = (long)ctx->attribute_count << 4;
        __s_00 = (MOJOSHADER_attribute *)(*ctx->malloc)((int)sVar25,ctx->malloc_data);
        if (__s_00 != (MOJOSHADER_attribute *)0x0) {
          pRVar20 = (ctx->attributes).next;
          memset(__s_00,0,sVar25);
          if (ctx->attribute_count < 1) {
            uVar8 = 0;
          }
          else {
            iVar17 = 0;
            uVar8 = 0;
            pMVar14 = __s_00;
            do {
              if (pRVar20 == (RegisterList *)0x0) {
                failf(ctx,"%s","BUG: mismatched attribute list and count");
                break;
              }
              RVar21 = pRVar20->regtype;
              if (RVar21 < REG_TYPE_LABEL) {
                if ((0x370U >> (RVar21 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) == 0) {
                  if ((0x2000aU >> (RVar21 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_LOOP)) & 1) == 0)
                  goto LAB_0010ae50;
                  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) goto LAB_0010ae9e;
                  goto LAB_0010ae73;
                }
              }
              else {
LAB_0010ae50:
                if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
                  failf(ctx,"%s","BUG: pixel shader with vertex attributes");
                }
                else {
LAB_0010ae73:
                  uVar9 = pRVar20->index;
                  pMVar14->usage = pRVar20->usage;
                  pMVar14->index = uVar9;
                  pcVar11 = (*ctx->profile->get_varname)(ctx,RVar21,pRVar20->regnum);
                  pMVar14->name = pcVar11;
                  pMVar14 = pMVar14 + 1;
                  uVar8 = uVar8 + 1;
                }
              }
LAB_0010ae9e:
              pRVar20 = pRVar20->next;
              iVar17 = iVar17 + 1;
            } while (iVar17 < ctx->attribute_count);
          }
          goto LAB_0010af08;
        }
        ctx->isfail = 1;
        ctx->out_of_memory = 1;
        __s_00 = (MOJOSHADER_attribute *)0x0;
        uVar8 = 0;
      }
      goto LAB_0010a6f3;
    }
    __s_00 = (MOJOSHADER_attribute *)0x0;
    uVar8 = 0;
    uVar9 = 0;
    pMVar14 = (MOJOSHADER_attribute *)0x0;
  }
  else {
LAB_0010a6cc:
    local_b0 = (MOJOSHADER_constant *)0x0;
LAB_0010a6e1:
    uVar8 = 0;
    __s_00 = (MOJOSHADER_attribute *)0x0;
    local_b8 = (MOJOSHADER_uniform *)0x0;
LAB_0010a6f3:
    uVar9 = 0;
    pMVar14 = (MOJOSHADER_attribute *)0x0;
  }
LAB_0010a6f6:
  if (ctx->isfail == 0) {
    sVar25 = (long)ctx->sampler_count * 0x18;
    local_a0 = (MOJOSHADER_sampler *)(*ctx->malloc)((int)sVar25,ctx->malloc_data);
    if (local_a0 == (MOJOSHADER_sampler *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      local_a0 = (MOJOSHADER_sampler *)0x0;
    }
    else {
      pRVar20 = (ctx->samplers).next;
      memset(local_a0,0,sVar25);
      if (0 < ctx->sampler_count) {
        piVar22 = &local_a0->texbem;
        lVar19 = 0;
        do {
          if (pRVar20 == (RegisterList *)0x0) {
            failf(ctx,"%s","BUG: mismatched sampler list and count");
            break;
          }
          if (pRVar20->regtype != REG_TYPE_SAMPLER) {
            __assert_fail("item->regtype == REG_TYPE_SAMPLER",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                          ,0x2cce,"MOJOSHADER_sampler *build_samplers(Context *)");
          }
          ((MOJOSHADER_sampler *)(piVar22 + -4))->type = pRVar20->index + ~MOJOSHADER_SAMPLER_CUBE;
          uVar7 = pRVar20->regnum;
          piVar22[-3] = uVar7;
          pcVar11 = (*ctx->profile->get_varname)(ctx,REG_TYPE_SAMPLER,uVar7);
          *(char **)(piVar22 + -2) = pcVar11;
          *piVar22 = (uint)(pRVar20->misc != 0);
          pRVar20 = pRVar20->next;
          lVar19 = lVar19 + 1;
          piVar22 = piVar22 + 6;
        } while (lVar19 < ctx->sampler_count);
      }
    }
  }
  else {
    local_a0 = (MOJOSHADER_sampler *)0x0;
  }
  uVar7 = errorlist_count(ctx->errors);
  pMVar13 = errorlist_flatten(ctx->errors);
  if (ctx->isfail == 0) {
    if (ctx->swizzles_count == 0) {
      __dest = (MOJOSHADER_swizzle *)0x0;
LAB_0010aa57:
      __s->profile = ctx->profile->name;
      __s->output = pcVar10;
      __s->output_len = (int)local_90;
      __s->instruction_count = ctx->instruction_count;
      __s->shader_type = ctx->shader_type;
      uVar29._0_1_ = ctx->major_ver;
      uVar29._1_1_ = ctx->minor_ver;
      uVar29._2_2_ = *(undefined2 *)&ctx->field_0x126;
      auVar3[0xc] = (char)((ushort)uVar29._2_2_ >> 8);
      auVar3._0_12_ = ZEXT712(0);
      auVar6[1] = 0;
      auVar6[0] = (byte)uVar29._2_2_;
      auVar6._2_3_ = auVar3._10_3_;
      auVar6._5_8_ = 0;
      auVar4[5] = 0;
      auVar4[4] = uVar29._1_1_;
      auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
      auVar4._0_4_ = uVar29 & 0xff;
      __s->major_ver = (int)auVar4._0_8_;
      __s->minor_ver = (int)((ulong)auVar4._0_8_ >> 0x20);
      __s->uniform_count = ctx->uniform_count;
      __s->uniforms = local_b8;
      __s->constant_count = ctx->constant_count;
      __s->constants = local_b0;
      __s->sampler_count = ctx->sampler_count;
      __s->samplers = local_a0;
      __s->attribute_count = uVar8;
      __s->attributes = __s_00;
      __s->output_count = uVar9;
      __s->outputs = pMVar14;
      __s->swizzle_count = ctx->swizzles_count;
      __s->swizzles = __dest;
      __s->symbol_count = (ctx->ctab).symbol_count;
      __s->symbols = (ctx->ctab).symbols;
      __s->preshader = ctx->preshader;
      __s->mainfn = ctx->mainfn;
      (ctx->ctab).symbols = (MOJOSHADER_symbol *)0x0;
      ctx->preshader = (MOJOSHADER_preshader *)0x0;
      (ctx->ctab).symbol_count = 0;
      ctx->mainfn = (char *)0x0;
      goto LAB_0010ab5b;
    }
    iVar17 = ctx->swizzles_count * 0xc;
    __dest = (MOJOSHADER_swizzle *)(*ctx->malloc)(iVar17,ctx->malloc_data);
    if (__dest == (MOJOSHADER_swizzle *)0x0) {
      ctx->isfail = 1;
      ctx->out_of_memory = 1;
      __dest = (MOJOSHADER_swizzle *)0x0;
    }
    else {
      memcpy(__dest,ctx->swizzles,(long)iVar17);
      if (ctx->isfail == 0) goto LAB_0010aa57;
    }
  }
  else {
    __dest = (MOJOSHADER_swizzle *)0x0;
  }
  (*ctx->free)(pcVar10,ctx->malloc_data);
  (*ctx->free)(local_b0,ctx->malloc_data);
  (*ctx->free)(__dest,ctx->malloc_data);
  if (local_b8 != (MOJOSHADER_uniform *)0x0) {
    if (0 < ctx->uniform_count) {
      ppcVar23 = &local_b8->name;
      lVar19 = 0;
      do {
        (*ctx->free)(*ppcVar23,ctx->malloc_data);
        lVar19 = lVar19 + 1;
        ppcVar23 = ppcVar23 + 3;
      } while (lVar19 < ctx->uniform_count);
    }
    (*ctx->free)(local_b8,ctx->malloc_data);
  }
  if (__s_00 != (MOJOSHADER_attribute *)0x0) {
    if (0 < (int)uVar8) {
      lVar19 = 0;
      do {
        (*ctx->free)(*(void **)((long)&__s_00->name + lVar19),ctx->malloc_data);
        lVar19 = lVar19 + 0x10;
      } while ((ulong)uVar8 << 4 != lVar19);
    }
    (*ctx->free)(__s_00,ctx->malloc_data);
  }
  if (pMVar14 != (MOJOSHADER_attribute *)0x0) {
    if (0 < (int)uVar9) {
      lVar19 = 0;
      do {
        (*ctx->free)(*(void **)((long)&pMVar14->name + lVar19),ctx->malloc_data);
        lVar19 = lVar19 + 0x10;
      } while ((ulong)uVar9 << 4 != lVar19);
    }
    (*ctx->free)(pMVar14,ctx->malloc_data);
  }
  if (local_a0 != (MOJOSHADER_sampler *)0x0) {
    if (0 < ctx->sampler_count) {
      ppcVar23 = &local_a0->name;
      lVar19 = 0;
      do {
        (*ctx->free)(*ppcVar23,ctx->malloc_data);
        lVar19 = lVar19 + 1;
        ppcVar23 = ppcVar23 + 3;
      } while (lVar19 < ctx->sampler_count);
    }
    (*ctx->free)(local_a0,ctx->malloc_data);
  }
  if (ctx->out_of_memory != 0) {
    if (0 < (int)uVar7) {
      lVar19 = 0;
      do {
        (*ctx->free)(*(void **)((long)&pMVar13->filename + lVar19),ctx->malloc_data);
        (*ctx->free)(*(void **)((long)&pMVar13->error + lVar19),ctx->malloc_data);
        lVar19 = lVar19 + 0x18;
      } while ((ulong)uVar7 * 0x18 != lVar19);
    }
    (*ctx->free)(pMVar13,ctx->malloc_data);
    (*ctx->free)(__s,ctx->malloc_data);
    return &MOJOSHADER_out_of_mem_data;
  }
LAB_0010ab5b:
  __s->error_count = uVar7;
  __s->errors = pMVar13;
  uVar8 = *(uint *)((long)&ctx->malloc + 4);
  uVar9 = *(uint *)&ctx->free;
  uVar7 = *(uint *)((long)&ctx->free + 4);
  uVar29 = -(uint)(*(uint *)&ctx->malloc == 0x12094c);
  uVar30 = -(uint)(uVar8 == 0);
  uVar31 = -(uint)(uVar9 == 0x120954);
  uVar32 = -(uint)(uVar7 == 0);
  *(uint *)&__s->malloc = ~(uVar30 & uVar29) & *(uint *)&ctx->malloc;
  *(uint *)((long)&__s->malloc + 4) = ~(uVar29 & uVar30) & uVar8;
  *(uint *)&__s->free = ~(uVar32 & uVar31) & uVar9;
  *(uint *)((long)&__s->free + 4) = ~(uVar31 & uVar32) & uVar7;
  __s->malloc_data = ctx->malloc_data;
  return __s;
}

Assistant:

static MOJOSHADER_parseData *build_parsedata(Context *ctx)
{
    char *output = NULL;
    MOJOSHADER_constant *constants = NULL;
    MOJOSHADER_uniform *uniforms = NULL;
    MOJOSHADER_attribute *attributes = NULL;
    MOJOSHADER_attribute *outputs = NULL;
    MOJOSHADER_sampler *samplers = NULL;
    MOJOSHADER_swizzle *swizzles = NULL;
    MOJOSHADER_error *errors = NULL;
    MOJOSHADER_parseData *retval = NULL;
    size_t output_len = 0;
    int attribute_count = 0;
    int output_count = 0;

    if (ctx->out_of_memory)
        return &MOJOSHADER_out_of_mem_data;

    retval = (MOJOSHADER_parseData*) Malloc(ctx, sizeof(MOJOSHADER_parseData));
    if (retval == NULL)
        return &MOJOSHADER_out_of_mem_data;

    memset(retval, '\0', sizeof (MOJOSHADER_parseData));

    if (!isfail(ctx))
        output = build_output(ctx, &output_len);

    if (!isfail(ctx))
        constants = build_constants(ctx);

    if (!isfail(ctx))
        uniforms = build_uniforms(ctx);

    if (!isfail(ctx))
        attributes = build_attributes(ctx, &attribute_count);

    if (!isfail(ctx))
        outputs = build_outputs(ctx, &output_count);

    if (!isfail(ctx))
        samplers = build_samplers(ctx);

    const int error_count = errorlist_count(ctx->errors);
    errors = errorlist_flatten(ctx->errors);

    if (!isfail(ctx))
    {
        if (ctx->swizzles_count > 0)
        {
            const int len = ctx->swizzles_count * sizeof (MOJOSHADER_swizzle);
            swizzles = (MOJOSHADER_swizzle *) Malloc(ctx, len);
            if (swizzles != NULL)
                memcpy(swizzles, ctx->swizzles, len);
        } // if
    } // if

    // check again, in case build_output, etc, ran out of memory.
    if (isfail(ctx))
    {
        int i;

        Free(ctx, output);
        Free(ctx, constants);
        Free(ctx, swizzles);

        if (uniforms != NULL)
        {
            for (i = 0; i < ctx->uniform_count; i++)
                Free(ctx, (void *) uniforms[i].name);
            Free(ctx, uniforms);
        } // if

        if (attributes != NULL)
        {
            for (i = 0; i < attribute_count; i++)
                Free(ctx, (void *) attributes[i].name);
            Free(ctx, attributes);
        } // if

        if (outputs != NULL)
        {
            for (i = 0; i < output_count; i++)
                Free(ctx, (void *) outputs[i].name);
            Free(ctx, outputs);
        } // if

        if (samplers != NULL)
        {
            for (i = 0; i < ctx->sampler_count; i++)
                Free(ctx, (void *) samplers[i].name);
            Free(ctx, samplers);
        } // if

        if (ctx->out_of_memory)
        {
            for (i = 0; i < error_count; i++)
            {
                Free(ctx, (void *) errors[i].filename);
                Free(ctx, (void *) errors[i].error);
            } // for
            Free(ctx, errors);
            Free(ctx, retval);
            return &MOJOSHADER_out_of_mem_data;
        } // if
    } // if
    else
    {
        retval->profile = ctx->profile->name;
        retval->output = output;
        retval->output_len = (int) output_len;
        retval->instruction_count = ctx->instruction_count;
        retval->shader_type = ctx->shader_type;
        retval->major_ver = (int) ctx->major_ver;
        retval->minor_ver = (int) ctx->minor_ver;
        retval->uniform_count = ctx->uniform_count;
        retval->uniforms = uniforms;
        retval->constant_count = ctx->constant_count;
        retval->constants = constants;
        retval->sampler_count = ctx->sampler_count;
        retval->samplers = samplers;
        retval->attribute_count = attribute_count;
        retval->attributes = attributes;
        retval->output_count = output_count;
        retval->outputs = outputs;
        retval->swizzle_count = ctx->swizzles_count;
        retval->swizzles = swizzles;
        retval->symbol_count = ctx->ctab.symbol_count;
        retval->symbols = ctx->ctab.symbols;
        retval->preshader = ctx->preshader;
        retval->mainfn = ctx->mainfn;

        // we don't own these now, retval does.
        ctx->ctab.symbols = NULL;
        ctx->preshader = NULL;
        ctx->ctab.symbol_count = 0;
        ctx->mainfn = NULL;
    } // else

    retval->error_count = error_count;
    retval->errors = errors;
    retval->malloc = (ctx->malloc == MOJOSHADER_internal_malloc) ? NULL : ctx->malloc;
    retval->free = (ctx->free == MOJOSHADER_internal_free) ? NULL : ctx->free;
    retval->malloc_data = ctx->malloc_data;

    return retval;
}